

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronFreePatterns(xmlSchematronPatternPtr_conflict patterns)

{
  xmlSchematronPatternPtr pxVar1;
  xmlSchematronPatternPtr_conflict next;
  xmlSchematronPatternPtr_conflict patterns_local;
  
  next = patterns;
  while (next != (xmlSchematronPatternPtr_conflict)0x0) {
    pxVar1 = next->next;
    if (next->name != (xmlChar *)0x0) {
      (*xmlFree)(next->name);
    }
    (*xmlFree)(next);
    next = pxVar1;
  }
  return;
}

Assistant:

static void
xmlSchematronFreePatterns(xmlSchematronPatternPtr patterns) {
    xmlSchematronPatternPtr next;

    while (patterns != NULL) {
        next = patterns->next;
        if (patterns->name != NULL)
            xmlFree(patterns->name);
        xmlFree(patterns);
        patterns = next;
    }
}